

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall OperandSymbol::defineOperand(OperandSymbol *this,TripleSymbol *tri)

{
  SleighError *this_00;
  allocator local_39;
  string local_38 [32];
  TripleSymbol *local_18;
  TripleSymbol *tri_local;
  OperandSymbol *this_local;
  
  if ((this->defexp == (PatternExpression *)0x0) && (this->triple == (TripleSymbol *)0x0)) {
    this->triple = tri;
    return;
  }
  local_18 = tri;
  tri_local = (TripleSymbol *)this;
  this_00 = (SleighError *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Redefining operand",&local_39);
  SleighError::SleighError(this_00,(string *)local_38);
  __cxa_throw(this_00,&SleighError::typeinfo,SleighError::~SleighError);
}

Assistant:

void OperandSymbol::defineOperand(TripleSymbol *tri)

{
  if ((defexp != (PatternExpression *)0)||(triple!=(TripleSymbol *)0))
    throw SleighError("Redefining operand");
  triple = tri;
}